

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool.cpp
# Opt level: O3

void bool_clause(vec<BoolView> *x,vec<BoolView> *y)

{
  ulong uVar1;
  long lVar2;
  Lit local_4c;
  vec<Lit> local_48;
  
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (Lit *)0x0;
  if (x->sz != 0) {
    lVar2 = 0xc;
    uVar1 = 0;
    do {
      local_4c.x = (uint)*(byte *)((long)&(x->data->super_Var).super_Branching._vptr_Branching +
                                  lVar2) + *(int *)((long)x->data + lVar2 + -4) * 2;
      vec<Lit>::push(&local_48,&local_4c);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < x->sz);
  }
  if (y->sz != 0) {
    lVar2 = 0xc;
    uVar1 = 0;
    do {
      local_4c.x = (*(byte *)((long)&(y->data->super_Var).super_Branching._vptr_Branching + lVar2) ^
                   1) + *(int *)((long)y->data + lVar2 + -4) * 2;
      vec<Lit>::push(&local_48,&local_4c);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < y->sz);
  }
  SAT::addClause(&sat,&local_48,false);
  if (local_48.data != (Lit *)0x0) {
    free(local_48.data);
  }
  return;
}

Assistant:

void bool_clause(vec<BoolView>& x, vec<BoolView>& y) {
	vec<Lit> ps;
	for (unsigned int i = 0; i < x.size(); i++) {
		ps.push(x[i]);
	}
	for (unsigned int i = 0; i < y.size(); i++) {
		ps.push(~y[i]);
	}
	sat.addClause(ps);
}